

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestNoDeadPointerFromDuplicateEdge::~ParserTestNoDeadPointerFromDuplicateEdge
          (ParserTestNoDeadPointerFromDuplicateEdge *this)

{
  ParserTestNoDeadPointerFromDuplicateEdge *this_local;
  
  ~ParserTestNoDeadPointerFromDuplicateEdge(this);
  operator_delete(this,0x1e8);
  return;
}

Assistant:

TEST_F(ParserTest, NoDeadPointerFromDuplicateEdge) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out: cat in\n"
"build out: cat in\n"
));
  // AssertParse() checks that the generated build graph is self-consistent.
  // That's all the checking that this test needs.
}